

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat3 * dja::adjugate(mat3 *__return_storage_ptr__,mat3 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  vec3 *pvVar5;
  float_t *pfVar6;
  mat3 *a;
  mat3 *m_local;
  
  mat3::mat3(__return_storage_ptr__,1.0);
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,0);
  pfVar6 = vec3::operator[](pvVar5,0);
  *pfVar6 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,0);
  pfVar6 = vec3::operator[](pvVar5,1);
  *pfVar6 = -fVar1 * fVar2 + fVar3 * fVar4;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,0);
  pfVar6 = vec3::operator[](pvVar5,2);
  *pfVar6 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,1);
  pfVar6 = vec3::operator[](pvVar5,0);
  *pfVar6 = -fVar1 * fVar2 + fVar3 * fVar4;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,1);
  pfVar6 = vec3::operator[](pvVar5,1);
  *pfVar6 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,2);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,1);
  pfVar6 = vec3::operator[](pvVar5,2);
  *pfVar6 = -fVar1 * fVar2 + fVar3 * fVar4;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,2);
  pfVar6 = vec3::operator[](pvVar5,0);
  *pfVar6 = fVar1 * fVar2 + -(fVar3 * fVar4);
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,2);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,2);
  pfVar6 = vec3::operator[](pvVar5,1);
  *pfVar6 = -fVar1 * fVar2 + fVar3 * fVar4;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar1 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar2 = *pfVar6;
  pvVar5 = mat3::operator[](m,0);
  pfVar6 = vec3::operator[](pvVar5,1);
  fVar3 = *pfVar6;
  pvVar5 = mat3::operator[](m,1);
  pfVar6 = vec3::operator[](pvVar5,0);
  fVar4 = *pfVar6;
  pvVar5 = mat3::operator[](__return_storage_ptr__,2);
  pfVar6 = vec3::operator[](pvVar5,2);
  *pfVar6 = fVar1 * fVar2 + -(fVar3 * fVar4);
  return __return_storage_ptr__;
}

Assistant:

mat3 adjugate(const mat3& m)
{
    mat3 a;

    M00(a) = M11(m) * M22(m) - M12(m) * M21(m);
    M01(a) =-M01(m) * M22(m) + M02(m) * M21(m);
    M02(a) = M01(m) * M12(m) - M02(m) * M11(m);

    M10(a) =-M10(m) * M22(m) + M12(m) * M20(m);
    M11(a) = M00(m) * M22(m) - M02(m) * M20(m);
    M12(a) =-M00(m) * M12(m) + M02(m) * M10(m);

    M20(a) = M10(m) * M21(m) - M11(m) * M20(m);
    M21(a) =-M00(m) * M21(m) + M01(m) * M20(m);
    M22(a) = M00(m) * M11(m) - M01(m) * M10(m);

    return a;
}